

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

CVmGramProdMatch *
CVmGramProdMatch::alloc
          (CVmGramProdMem *mem,size_t tok_pos,vm_val_t *tok_match_result,int matched_star,
          vm_prop_id_t target_prop,vm_obj_id_t proc_obj,CVmGramProdMatch **sub_match_list,
          size_t sub_match_cnt)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  CVmGramProdMatch *pCVar3;
  vm_val_t *pvVar4;
  
  pCVar3 = (CVmGramProdMatch *)CVmGramProdMem::alloc(mem,0x38);
  pCVar3->tok_pos_ = tok_pos;
  pCVar3->matched_star_ = matched_star;
  pCVar3->target_prop_ = target_prop;
  pCVar3->proc_obj_ = proc_obj;
  pCVar3->sub_match_list_ = sub_match_list;
  pCVar3->sub_match_cnt_ = sub_match_cnt;
  pvVar4 = &pCVar3->tok_match_result_;
  if (tok_match_result == (vm_val_t *)0x0) {
    pvVar4->typ = VM_NIL;
  }
  else {
    uVar2 = *(undefined4 *)&tok_match_result->field_0x4;
    aVar1 = tok_match_result->val;
    pvVar4->typ = tok_match_result->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar2;
    (pCVar3->tok_match_result_).val = aVar1;
  }
  return pCVar3;
}

Assistant:

static CVmGramProdMatch *alloc(CVmGramProdMem *mem, size_t tok_pos,
                                   const vm_val_t *tok_match_result,
                                   int matched_star,
                                   vm_prop_id_t target_prop,
                                   vm_obj_id_t proc_obj,
                                   const CVmGramProdMatch **sub_match_list,
                                   size_t sub_match_cnt)
    {
        CVmGramProdMatch *match;
        
        /* allocate space */
        match = (CVmGramProdMatch *)mem->alloc(sizeof(CVmGramProdMatch));

        /* initialize */
        match->tok_pos_ = tok_pos;
        match->matched_star_ = matched_star;
        match->target_prop_ = target_prop;
        match->proc_obj_ = proc_obj;
        match->sub_match_list_ = sub_match_list;
        match->sub_match_cnt_ = sub_match_cnt;

        /* save the token match value, if one was given */
        if (tok_match_result != 0)
            match->tok_match_result_ = *tok_match_result;
        else
            match->tok_match_result_.set_nil();

        /* return the new match */
        return match;
    }